

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O2

bool __thiscall GoState<5U,_4U>::is_move_possible(GoState<5U,_4U> *this,int i,int j,int player)

{
  int iVar1;
  uint uVar2;
  const_iterator cVar3;
  uchar *puVar4;
  byte bVar5;
  byte bVar6;
  key_type_conflict local_64;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  pieces;
  
  if (3 < (uint)j || 4 < (uint)i) {
    return false;
  }
  if (this->board[(uint)i][(uint)j] != '\0') {
    return false;
  }
  pieces._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pieces._M_t._M_impl.super__Rb_tree_header._M_header;
  pieces._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pieces._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pieces._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar4 = this->board[(uint)i] + (uint)j;
  *puVar4 = (uchar)player;
  pieces._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pieces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar1 = (*this->_vptr_GoState[9])(this,(ulong)(uint)i,(ulong)(uint)j,&pieces);
  bVar5 = 1;
  if ((char)iVar1 == '\0') {
    uVar2 = 3 - player;
    if (i != 0) {
      if ((uVar2 != this->board[i - 1][(uint)j]) ||
         (iVar1 = (*this->_vptr_GoState[9])(this,(ulong)(i - 1),(ulong)(uint)j,&pieces),
         (char)iVar1 != '\0')) {
        if ((uint)i < 4) goto LAB_00145252;
        goto LAB_00145290;
      }
      goto LAB_0014518f;
    }
LAB_00145252:
    if ((uVar2 == this->board[(ulong)(uint)i + 1][(uint)j]) &&
       (iVar1 = (*this->_vptr_GoState[9])(this,(ulong)(i + 1),(ulong)(uint)j,&pieces),
       (char)iVar1 == '\0')) goto LAB_0014518f;
LAB_00145290:
    if (j == 0) {
LAB_001452d7:
      if (uVar2 != this->board[(uint)i][(ulong)(uint)j + 1]) goto LAB_0014530e;
      iVar1 = (*this->_vptr_GoState[9])(this,(ulong)(uint)i,(ulong)(j + 1),&pieces);
      bVar5 = (byte)iVar1 ^ 1;
      if ((byte)iVar1 == 0) goto LAB_0014518f;
      goto LAB_001451d0;
    }
    if ((uVar2 == this->board[(uint)i][j - 1]) &&
       (iVar1 = (*this->_vptr_GoState[9])(this,(ulong)(uint)i,(ulong)(j - 1),&pieces),
       (char)iVar1 == '\0')) goto LAB_0014518f;
    if ((uint)j < 3) goto LAB_001452d7;
  }
  else {
LAB_0014518f:
    uVar2 = (*this->_vptr_GoState[4])(this);
    if (uVar2 != this->previous_board_hash_value) {
      local_64 = (*this->_vptr_GoState[4])(this);
      cVar3 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::find(&(this->all_hash_values)._M_t,&local_64);
      if ((_Rb_tree_header *)cVar3._M_node !=
          &(this->all_hash_values)._M_t._M_impl.super__Rb_tree_header) {
        bVar5 = 0;
      }
LAB_001451d0:
      bVar6 = bVar5;
      if (bVar5 != 0) {
        iVar1 = (*this->_vptr_GoState[7])(this,(ulong)(uint)i,(ulong)(uint)j,(ulong)(uint)player);
        bVar6 = 0;
        if ((char)iVar1 == '\0') {
          bVar6 = bVar5;
        }
      }
      goto LAB_00145310;
    }
  }
LAB_0014530e:
  bVar6 = 0;
LAB_00145310:
  *puVar4 = '\0';
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&pieces._M_t);
  return (bool)bVar6;
}

Assistant:

virtual bool is_move_possible(const int i, const int j, const int player) const
	{
		const int opponent = 3 - player;

		if (0 <= i && i < M && 0 <= j && j < N) {
			if (board[i][j] != empty) {
				return false;
			}

			// See if it is possible to move into this empty place.
			std::set<std::pair<int, int>> pieces;
			board[i][j] = player;

			bool possible = false;
			if (is_alive(i, j, &pieces)) {
				// This stone is immediately alive.
				possible = true;
			}
			else {
				// This stone may have killed opponents so
				// that it is alive.

				if (i > 0 && board[i - 1][j] == opponent && !is_alive(i - 1, j, &pieces)) {
					possible = true;
				}
				else if (i < M - 1 && board[i + 1][j] == opponent && !is_alive(i + 1, j, &pieces)) {
					possible = true;
				}
				else if (j > 0 && board[i][j - 1] == opponent && !is_alive(i, j - 1, &pieces)) {
					possible = true;
				}
				else if (j < N - 1 && board[i][j + 1] == opponent && !is_alive(i, j + 1, &pieces)) {
					possible = true;
				}
			}

			if (possible) {
				// Ko rule tests.
				if (compute_hash_value() == previous_board_hash_value) {			
					possible = false;
				}
				else if (all_hash_values.find(compute_hash_value()) != all_hash_values.end()) {
					possible = false;
				}
			}

			if (possible) {
				// Not possible to play in one's own eye.
				if (is_eye(i, j, player)) {
					possible = false;
				}
			}

			board[i][j] = empty;
			return possible;
		}
		else {
			// Not a valid position.
			return false;
		}
	}